

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O2

uint64_t lzma_raw_coder_memusage(lzma_filter_find coder_find,lzma_filter *filters)

{
  lzma_ret lVar1;
  lzma_filter_coder *plVar2;
  uint64_t uVar3;
  lzma_vli lVar4;
  long lVar5;
  lzma_filter *plVar6;
  size_t tmp;
  
  lVar1 = validate_chain(filters,&tmp);
  uVar3 = 0xffffffffffffffff;
  if (lVar1 == LZMA_OK) {
    lVar4 = filters->id;
    plVar6 = filters + 1;
    lVar5 = 0;
    do {
      plVar2 = (*coder_find)(lVar4);
      if (plVar2 == (lzma_filter_coder *)0x0) {
        return 0xffffffffffffffff;
      }
      if (plVar2->memusage == (_func_uint64_t_void_ptr *)0x0) {
        lVar5 = lVar5 + 0x400;
      }
      else {
        uVar3 = (*plVar2->memusage)(plVar6[-1].options);
        if (uVar3 == 0xffffffffffffffff) {
          return 0xffffffffffffffff;
        }
        lVar5 = lVar5 + uVar3;
      }
      lVar4 = plVar6->id;
      plVar6 = plVar6 + 1;
    } while (lVar4 != 0xffffffffffffffff);
    uVar3 = lVar5 + 0x8000;
  }
  return uVar3;
}

Assistant:

extern uint64_t
lzma_raw_coder_memusage(lzma_filter_find coder_find,
		const lzma_filter *filters)
{
	uint64_t total = 0;
	size_t i = 0;

	// The chain has to have at least one filter.
	{
		size_t tmp;
		if (validate_chain(filters, &tmp) != LZMA_OK)
			return UINT64_MAX;
	}

	do {
		const lzma_filter_coder *const fc
				 = coder_find(filters[i].id);
		if (fc == NULL)
			return UINT64_MAX; // Unsupported Filter ID

		if (fc->memusage == NULL) {
			// This filter doesn't have a function to calculate
			// the memory usage and validate the options. Such
			// filters need only little memory, so we use 1 KiB
			// as a good estimate. They also accept all possible
			// options, so there's no need to worry about lack
			// of validation.
			total += 1024;
		} else {
			// Call the filter-specific memory usage calculation
			// function.
			const uint64_t usage
					= fc->memusage(filters[i].options);
			if (usage == UINT64_MAX)
				return UINT64_MAX; // Invalid options

			total += usage;
		}
	} while (filters[++i].id != LZMA_VLI_UNKNOWN);

	// Add some fixed amount of extra. It's to compensate memory usage
	// of Stream, Block etc. coders, malloc() overhead, stack etc.
	return total + LZMA_MEMUSAGE_BASE;
}